

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * __thiscall
QPDF::getTrimmedUserPassword_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  pointer pMVar1;
  element_type *peVar2;
  QPDF *this_local;
  string *result;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar2 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar1->encp);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar2->user_password);
  trim_user_password(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getTrimmedUserPassword() const
{
    std::string result = m->encp->user_password;
    trim_user_password(result);
    return result;
}